

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O3

void __thiscall
optimization::graph_color::Conflict_Map::Conflict_Map
          (Conflict_Map *this,
          shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>
          *color_map,MirFunction *func,u_int color_num)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  string *psVar3;
  uint uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  size_t *psVar6;
  _Base_ptr *pp_Var7;
  char cVar8;
  int iVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  long lVar11;
  undefined8 uVar12;
  size_type sVar13;
  mapped_type *pmVar14;
  _Base_ptr p_Var15;
  _Rb_tree_node_base *p_Var16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  char *pcVar19;
  Function *tag;
  uint32_t uVar20;
  _Base_ptr p_Var21;
  VarId var;
  VarId var_1;
  ostream local_189;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  undefined1 local_120;
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  *local_118;
  Function local_110;
  _Base_ptr local_b8;
  undefined **local_b0;
  undefined4 local_a8;
  undefined **local_a0;
  undefined8 local_98;
  undefined1 local_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  VarId local_70;
  _func_int **local_60;
  undefined4 local_58;
  undefined1 local_50 [16];
  VarId local_40;
  
  p_Var1 = &(this->static_Map)._M_t._M_impl.super__Rb_tree_header;
  (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->static_Map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header;
  (this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dynamic_Map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118 = &this->merged_var_Map;
  p_Var1 = &(this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header;
  (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88 = &(this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_88;
  (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_88;
  (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->edge_vars)._M_t._M_impl.super__Rb_tree_header;
  (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->remove_Nodes).c.super__Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::_Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::_M_initialize_map
            ((_Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&this->remove_Nodes
             ,0);
  (this->color_map).
  super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (color_map->
            super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  p_Var5 = (color_map->
           super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  (this->color_map).
  super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var5;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  (this->unused_colors).
  super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->unused_colors).
  super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = &(this->priority_map)._M_t._M_impl.super__Rb_tree_header;
  (this->priority_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->priority_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->priority_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->priority_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->priority_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->func = func;
  this->color_num = color_num;
  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  p_Var10->_M_use_count = 1;
  p_Var10->_M_weak_count = 1;
  p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001eba50;
  p_Var10[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[1]._M_use_count = 0;
  p_Var10[1]._M_weak_count = 0;
  tag = (Function *)0x0;
  p_Var10[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(_Atomic_word **)&p_Var10[2]._M_use_count = &p_Var10[1]._M_use_count;
  p_Var10[3]._vptr__Sp_counted_base = (_func_int **)&p_Var10[1]._M_use_count;
  p_Var10[3]._M_use_count = 0;
  p_Var10[3]._M_weak_count = 0;
  (this->unused_colors).
  super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(p_Var10 + 1);
  p_Var5 = (this->unused_colors).
           super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->unused_colors).
  super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var10;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  local_110._vptr_Function._0_4_ = 0;
  uVar4 = (uint)local_110._vptr_Function;
  local_110._vptr_Function._0_4_ = 0;
  if (color_num != 0) {
    do {
      tag = &local_110;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 (this->unused_colors).
                 super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(int *)&local_110);
      local_110._vptr_Function._0_4_ = (uint)local_110._vptr_Function + 1;
      uVar4 = (uint)local_110._vptr_Function;
    } while ((uint)local_110._vptr_Function < color_num);
  }
  local_110._vptr_Function._0_4_ = uVar4;
  if ((func->variables)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    iVar9 = 0xffff;
  }
  else {
    lVar11 = std::_Rb_tree_decrement
                       (&(func->variables)._M_t._M_impl.super__Rb_tree_header._M_header);
    iVar9 = *(int *)(lVar11 + 0x20);
  }
  this->varId = iVar9;
  p_Var15 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_80 = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var15 != local_80) {
    psVar3 = &local_110.name;
    do {
      p_Var21 = p_Var15[3]._M_parent;
      p_Var17 = p_Var15[3]._M_left;
      local_b8 = p_Var17;
      local_78 = p_Var15;
      if (p_Var21 != p_Var17) {
        do {
          iVar9 = (**(code **)(**(long **)p_Var21 + 8))();
          if (iVar9 == 7) {
            (**(code **)(**(long **)p_Var21 + 0x10))(&local_110);
            if ((string *)local_110.name.field_2._M_allocated_capacity != psVar3) {
              p_Var15 = (this->merged_var_Map)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_parent;
              uVar12 = local_110.name.field_2._M_allocated_capacity;
              do {
                local_148._0_8_ = &PTR_display_001eb100;
                uVar4 = *(uint *)&((_Rb_tree_node_base *)(uVar12 + 0x20))->_M_parent;
                local_148._8_4_ = uVar4;
                p_Var17 = &p_Var1->_M_header;
                p_Var18 = p_Var15;
                if (p_Var15 != (_Base_ptr)0x0) {
                  do {
                    psVar6 = (size_t *)(p_Var18 + 1);
                    if (*(uint *)(psVar6 + 1) >= uVar4) {
                      p_Var17 = p_Var18;
                    }
                    pp_Var7 = &p_Var18->_M_left;
                    p_Var18 = pp_Var7[*(uint *)(psVar6 + 1) < uVar4];
                  } while (pp_Var7[*(uint *)(psVar6 + 1) < uVar4] != (_Base_ptr)0x0);
                  if (((_Rb_tree_header *)p_Var17 != p_Var1) &&
                     (*(uint *)((long)p_Var17 + 0x28) <= uVar4)) {
                    pmVar14 = std::
                              map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                              ::at(local_118,(key_type *)local_148);
                    uVar20 = pmVar14->id;
                    std::
                    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                 *)&local_110);
                    if (uVar20 != 0) goto LAB_0013d3a1;
                    goto LAB_0013d333;
                  }
                }
                uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12);
              } while ((string *)uVar12 != psVar3);
            }
            std::
            _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
            ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                         *)&local_110);
LAB_0013d333:
            sVar13 = std::
                     map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                     ::count(local_118,(key_type *)(*(long *)p_Var21 + 8));
            if (sVar13 == 0) {
              uVar20 = this->varId + 1;
              this->varId = uVar20;
            }
            else {
              pmVar14 = std::
                        map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                        ::at(local_118,(key_type *)(*(long *)p_Var21 + 8));
              uVar20 = pmVar14->id;
            }
LAB_0013d3a1:
            local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
            local_40.id = *(uint32_t *)(*(long *)p_Var21 + 0x10);
            local_50._0_8_ = &PTR_display_001eb100;
            local_50._8_4_ = uVar20;
            merge(this,&local_40,(VarId *)local_50);
            tag = *(Function **)p_Var21;
            (*((Displayable *)&tag->_vptr_Function)->_vptr_Displayable[2])(&local_110);
            for (uVar12 = local_110.name.field_2._M_allocated_capacity; (string *)uVar12 != psVar3;
                uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
              local_58 = *(undefined4 *)&((_Rb_tree_node_base *)(uVar12 + 0x20))->_M_parent;
              local_60 = (_func_int **)&PTR_display_001eb100;
              local_70.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
              tag = (Function *)&local_60;
              local_70.id = uVar20;
              merge(this,(VarId *)tag,&local_70);
            }
            std::
            _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
            ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                         *)&local_110);
            p_Var17 = local_b8;
          }
          p_Var21 = (_Base_ptr)&p_Var21->_M_parent;
        } while (p_Var21 != p_Var17);
      }
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(local_78);
    } while (p_Var15 != local_80);
  }
  p_Var15 = (this->merged_Map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var15 != local_88) {
    do {
      local_b0 = (undefined **)((ulong)local_b0 & 0xffffffffffffff00);
      AixLog::operator<<((ostream *)&local_b0,(Severity *)tag);
      local_148._0_8_ = &PTR__Tag_001eaf88;
      local_148._8_8_ = &local_130;
      local_138 = 0;
      local_130 = 0;
      local_120 = 1;
      AixLog::operator<<((ostream *)local_148,(Tag *)tag);
      local_98 = std::chrono::_V2::system_clock::now();
      local_a0 = &PTR__Timestamp_001eaf58;
      local_90 = 0;
      AixLog::operator<<((ostream *)&local_a0,(Timestamp *)tag);
      local_168 = &local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Conflict_Map","");
      pcVar19 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
      ;
      local_188 = &local_178;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                 ,"");
      local_110._vptr_Function = (_func_int **)&PTR__Function_001eafb8;
      local_110.name._M_dataplus._M_p = (pointer)&local_110.name.field_2;
      if (local_168 == &local_158) {
        local_110.name.field_2._8_8_ = local_158._8_8_;
      }
      else {
        local_110.name._M_dataplus._M_p = (pointer)local_168;
      }
      local_110.name.field_2._M_allocated_capacity._1_7_ = local_158._M_allocated_capacity._1_7_;
      local_110.name.field_2._M_local_buf[0] = local_158._M_local_buf[0];
      local_110.name._M_string_length = local_160;
      local_160 = 0;
      local_158._M_local_buf[0] = '\0';
      local_110.file._M_dataplus._M_p = (pointer)&local_110.file.field_2;
      if (local_188 == &local_178) {
        local_110.file.field_2._8_8_ = local_178._8_8_;
      }
      else {
        local_110.file._M_dataplus._M_p = (pointer)local_188;
      }
      local_110.file.field_2._M_allocated_capacity._1_7_ = local_178._M_allocated_capacity._1_7_;
      local_110.file.field_2._M_local_buf[0] = local_178._M_local_buf[0];
      local_110.file._M_string_length = local_180;
      local_180 = 0;
      local_178._M_local_buf[0] = '\0';
      local_110.line = 0x52;
      local_110.is_null_ = false;
      local_188 = &local_178;
      local_168 = &local_158;
      AixLog::operator<<((ostream *)&local_110,(Function *)pcVar19);
      (*(code *)**(undefined8 **)(p_Var15 + 1))(p_Var15 + 1,&std::clog);
      pcVar19 = " representes these vars : ";
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog," representes these vars : ",0x1a);
      AixLog::Function::~Function(&local_110);
      if (local_188 != &local_178) {
        pcVar19 = (char *)(CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0])
                          + 1);
        operator_delete(local_188,(ulong)pcVar19);
      }
      if (local_168 != &local_158) {
        pcVar19 = (char *)(CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0])
                          + 1);
        operator_delete(local_168,(ulong)pcVar19);
      }
      local_148._0_8_ = &PTR__Tag_001eaf88;
      if ((undefined1 *)local_148._8_8_ != &local_130) {
        pcVar19 = (char *)(CONCAT71(uStack_12f,local_130) + 1);
        operator_delete((void *)local_148._8_8_,(ulong)pcVar19);
      }
      local_b8 = p_Var15;
      for (p_Var16 = p_Var15[2]._M_parent; p_Var16 != (_Rb_tree_node_base *)&p_Var15[1]._M_right;
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
        local_b0 = &PTR_display_001eb100;
        local_a8 = *(undefined4 *)&p_Var16[1]._M_parent;
        local_189 = (ostream)0x0;
        AixLog::operator<<(&local_189,(Severity *)pcVar19);
        local_148._0_8_ = &PTR__Tag_001eaf88;
        local_148._8_8_ = &local_130;
        local_138 = 0;
        local_130 = 0;
        local_120 = 1;
        AixLog::operator<<((ostream *)local_148,(Tag *)pcVar19);
        local_98 = std::chrono::_V2::system_clock::now();
        local_a0 = &PTR__Timestamp_001eaf58;
        local_90 = 0;
        AixLog::operator<<((ostream *)&local_a0,(Timestamp *)pcVar19);
        local_168 = &local_158;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Conflict_Map","");
        pcVar19 = 
        "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
        ;
        local_188 = &local_178;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_188,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                   ,"");
        local_110._vptr_Function = (_func_int **)&PTR__Function_001eafb8;
        local_110.name._M_dataplus._M_p = (pointer)&local_110.name.field_2;
        if (local_168 == &local_158) {
          local_110.name.field_2._8_8_ = local_158._8_8_;
        }
        else {
          local_110.name._M_dataplus._M_p = (pointer)local_168;
        }
        local_110.name.field_2._M_allocated_capacity._1_7_ = local_158._M_allocated_capacity._1_7_;
        local_110.name.field_2._M_local_buf[0] = local_158._M_local_buf[0];
        local_110.name._M_string_length = local_160;
        local_160 = 0;
        local_158._M_local_buf[0] = '\0';
        local_110.file._M_dataplus._M_p = (pointer)&local_110.file.field_2;
        if (local_188 == &local_178) {
          local_110.file.field_2._8_8_ = local_178._8_8_;
        }
        else {
          local_110.file._M_dataplus._M_p = (pointer)local_188;
        }
        local_110.file.field_2._M_allocated_capacity._1_7_ = local_178._M_allocated_capacity._1_7_;
        local_110.file.field_2._M_local_buf[0] = local_178._M_local_buf[0];
        local_110.file._M_string_length = local_180;
        local_180 = 0;
        local_178._M_local_buf[0] = '\0';
        local_110.line = 0x54;
        local_110.is_null_ = false;
        local_188 = &local_178;
        local_168 = &local_158;
        AixLog::operator<<((ostream *)&local_110,(Function *)pcVar19);
        (*(code *)*local_b0)(&local_b0,&std::clog);
        pcVar19 = ", ";
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,", ",2);
        AixLog::Function::~Function(&local_110);
        if (local_188 != &local_178) {
          pcVar19 = (char *)(CONCAT71(local_178._M_allocated_capacity._1_7_,
                                      local_178._M_local_buf[0]) + 1);
          operator_delete(local_188,(ulong)pcVar19);
        }
        if (local_168 != &local_158) {
          pcVar19 = (char *)(CONCAT71(local_158._M_allocated_capacity._1_7_,
                                      local_158._M_local_buf[0]) + 1);
          operator_delete(local_168,(ulong)pcVar19);
        }
        local_148._0_8_ = &PTR__Tag_001eaf88;
        if ((undefined1 *)local_148._8_8_ != &local_130) {
          pcVar19 = (char *)(CONCAT71(uStack_12f,local_130) + 1);
          operator_delete((void *)local_148._8_8_,(ulong)pcVar19);
        }
      }
      local_b0 = (undefined **)((ulong)local_b0 & 0xffffffffffffff00);
      AixLog::operator<<((ostream *)&local_b0,(Severity *)pcVar19);
      local_148._0_8_ = &PTR__Tag_001eaf88;
      local_148._8_8_ = &local_130;
      local_138 = 0;
      local_130 = 0;
      local_120 = 1;
      AixLog::operator<<((ostream *)local_148,(Tag *)pcVar19);
      p_Var15 = local_b8;
      local_98 = std::chrono::_V2::system_clock::now();
      local_a0 = &PTR__Timestamp_001eaf58;
      local_90 = 0;
      AixLog::operator<<((ostream *)&local_a0,(Timestamp *)pcVar19);
      local_168 = &local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Conflict_Map","");
      pcVar19 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
      ;
      local_188 = &local_178;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                 ,"");
      local_110._vptr_Function._0_4_ = 0x1eafb8;
      local_110._vptr_Function._4_4_ = 0;
      local_110.name._M_dataplus._M_p = (pointer)&local_110.name.field_2;
      if (local_168 == &local_158) {
        local_110.name.field_2._8_8_ = local_158._8_8_;
      }
      else {
        local_110.name._M_dataplus._M_p = (pointer)local_168;
      }
      local_110.name.field_2._M_allocated_capacity._1_7_ = local_158._M_allocated_capacity._1_7_;
      local_110.name.field_2._M_local_buf[0] = local_158._M_local_buf[0];
      local_110.name._M_string_length = local_160;
      local_160 = 0;
      local_158._M_local_buf[0] = '\0';
      local_110.file._M_dataplus._M_p = (pointer)&local_110.file.field_2;
      if (local_188 == &local_178) {
        local_110.file.field_2._8_8_ = local_178._8_8_;
      }
      else {
        local_110.file._M_dataplus._M_p = (pointer)local_188;
      }
      local_110.file.field_2._M_allocated_capacity._1_7_ = local_178._M_allocated_capacity._1_7_;
      local_110.file.field_2._M_local_buf[0] = local_178._M_local_buf[0];
      local_110.file._M_string_length = local_180;
      local_180 = 0;
      local_178._M_local_buf[0] = '\0';
      local_110.line = 0x56;
      local_110.is_null_ = false;
      local_188 = &local_178;
      local_168 = &local_158;
      AixLog::operator<<((ostream *)&local_110,(Function *)pcVar19);
      cVar8 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
      tag = (Function *)(ulong)(uint)(int)cVar8;
      std::ostream::put(-0x80);
      std::ostream::flush();
      AixLog::Function::~Function(&local_110);
      if (local_188 != &local_178) {
        tag = (Function *)
              (CONCAT71(local_178._M_allocated_capacity._1_7_,local_178._M_local_buf[0]) + 1);
        operator_delete(local_188,(ulong)tag);
      }
      if (local_168 != &local_158) {
        tag = (Function *)
              (CONCAT71(local_158._M_allocated_capacity._1_7_,local_158._M_local_buf[0]) + 1);
        operator_delete(local_168,(ulong)tag);
      }
      local_148._0_8_ = &PTR__Tag_001eaf88;
      if ((undefined1 *)local_148._8_8_ != &local_130) {
        tag = (Function *)(CONCAT71(uStack_12f,local_130) + 1);
        operator_delete((void *)local_148._8_8_,(ulong)tag);
      }
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != local_88);
  }
  return;
}

Assistant:

Conflict_Map(std::shared_ptr<Color_Map> color_map,
               mir::inst::MirFunction& func, u_int color_num = 8)
      : color_num(color_num), color_map(color_map), func(func) {
    unused_colors = std::make_shared<std::set<int>>();
    for (int i = 0; i < color_num; i++) {
      unused_colors->insert(i);
    }
    if (func.variables.size()) {
      auto end_iter = func.variables.end();
      end_iter--;
      varId = end_iter->first;
    } else {
      varId = mir::inst::VarId(65535);
    }
    for (auto& blkiter : func.basic_blks) {
      for (auto& inst : blkiter.second.inst) {
        if (inst->inst_kind() == mir::inst::InstKind::Phi) {
          mir::inst::VarId new_VarId(0);
          for (auto var : inst->useVars()) {
            if (merged_var_Map.count(var)) {
              new_VarId = merged_var_Map.at(var);
              break;
            }
          }
          if (new_VarId.id == 0) {
            if (merged_var_Map.count(inst->dest)) {
              new_VarId = merged_var_Map.at(inst->dest);
            } else {
              new_VarId = get_new_VarId();
            }
          }
          merge(inst->dest, new_VarId);
          for (auto var : inst->useVars()) {
            merge(var, new_VarId);
          }
          // LOG(TRACE) << new_VarId << " : ";
          // for (auto var : inst->useVars()) {
          //   LOG(TRACE) << var << ", ";
          // }
          // LOG(TRACE) << std::endl;
        }
      }
    }
    for (auto& pair : merged_Map) {
      LOG(TRACE) << pair.first << " representes these vars : ";
      for (auto var : pair.second) {
        LOG(TRACE) << var << ", ";
      }
      LOG(TRACE) << std::endl;
    }
  }